

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O1

size_t zmCreateBarr_deep(size_t no)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  ulong n;
  
  n = no + 7 >> 3;
  sVar1 = zzRedBarrStart_deep(n);
  sVar2 = zmMulBarr_deep(n);
  sVar3 = zmSqrBarr_deep(n);
  sVar4 = zzInvMod_deep(n);
  sVar5 = zzDivMod_deep(n);
  sVar1 = utilMax(5,sVar1,sVar2,sVar3,sVar4,sVar5);
  return sVar1;
}

Assistant:

size_t zmCreateBarr_deep(size_t no)
{
	const size_t n = W_OF_O(no);
	return utilMax(5,
		zzRedBarrStart_deep(n),
		zmMulBarr_deep(n),
		zmSqrBarr_deep(n),
		zmInv_deep(n),
		zmDiv_deep(n));
}